

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_1a0 [8];
  ostringstream buf;
  char *colorMixName;
  bool hasTessellation;
  DepthDrawCase *this_local;
  
  pcVar1 = "vtx_colorMix";
  if (*(int *)((long)this + 0x84) == 1) {
    pcVar1 = "tess_eval_colorMix";
  }
  buf._368_8_ = pcVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"${GLSL_VERSION_DECL}\nin mediump vec4 ");
  poVar2 = std::operator<<(poVar2,(char *)buf._368_8_);
  std::operator<<(poVar2,";\n");
  if (*(int *)((long)this + 0x80) == 1) {
    std::operator<<((ostream *)local_1a0,"in mediump float v_fragDepth;\n");
  }
  poVar2 = std::operator<<((ostream *)local_1a0,
                           "layout(location = 0) out mediump vec4 o_color;\nuniform highp vec4 u_color1;\nuniform highp vec4 u_color2;\n\nvoid main()\n{\n\to_color = mix(u_color1, u_color2, "
                          );
  poVar2 = std::operator<<(poVar2,(char *)buf._368_8_);
  std::operator<<(poVar2,");\n");
  if (*(int *)((long)this + 0x80) == 1) {
    std::operator<<((ostream *)local_1a0,"\tgl_FragDepth = v_fragDepth * 0.5 + 0.5;\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string DepthDrawCase::genFragmentSource (void) const
{
	const bool			hasTessellation	= (m_state == STATE_PER_PRIMITIVE);
	const char* const	colorMixName	= (hasTessellation) ? ("tess_eval_colorMix") : ("vtx_colorMix");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in mediump vec4 " << colorMixName << ";\n";

	if (m_depthType == DEPTH_USER_DEFINED)
		buf << "in mediump float v_fragDepth;\n";

	buf <<	"layout(location = 0) out mediump vec4 o_color;\n"
			"uniform highp vec4 u_color1;\n"
			"uniform highp vec4 u_color2;\n"
			"\n"
			"void main()\n"
			"{\n"
			"	o_color = mix(u_color1, u_color2, " << colorMixName << ");\n";

	if (m_depthType == DEPTH_USER_DEFINED)
		buf << "	gl_FragDepth = v_fragDepth * 0.5 + 0.5;\n";

	buf <<	"}\n";

	return buf.str();
}